

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O2

int __thiscall
sigs::
BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>
::connect(BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  pthread_mutex_t *__mutex;
  undefined4 in_register_00000034;
  __shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  Entry local_68;
  
  __mutex = (pthread_mutex_t *)(CONCAT44(in_register_00000034,__fd) + 0x20);
  std::mutex::lock((mutex *)&__mutex->__data);
  makeConnection(this);
  std::__shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_78,(__shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2> *)this);
  Entry::Entry(&local_68,(Slot *)__addr,(Connection *)&_Stack_78);
  std::
  vector<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry>>
  ::emplace_back<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry>
            ((vector<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry>>
              *)(CONCAT44(in_register_00000034,__fd) + 8),&local_68);
  Entry::~Entry(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78._M_refcount);
  pthread_mutex_unlock(__mutex);
  return (int)this;
}

Assistant:

Connection connect(Slot &&slot) noexcept
  {
    Lock lock(entriesMutex);
    auto conn = makeConnection();
    entries.emplace_back(Entry(std::move(slot), conn));
    return conn;
  }